

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void vocini(voccxdef *vocctx,errcxdef *errctx,mcmcxdef *memctx,runcxdef *runctx,objucxdef *undoctx,
           int fuses,int daemons,int notifiers)

{
  voccxdef *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  vocddef **in_R8;
  int in_R9D;
  undefined4 in_stack_00000008;
  
  memset(in_RDI,0,0x11c0);
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 0xac) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x564) = 0x2000;
  in_RDI[3] = in_RDX;
  in_RDI[2] = in_RCX;
  in_RDI[4] = in_R8;
  *(undefined2 *)((long)in_RDI + 0xf4c) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x110c) = 0xffff;
  *(undefined2 *)(in_RDI + 0x221) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x1106) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x1104) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x1102) = 0xffff;
  *(undefined2 *)(in_RDI + 0x220) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10fe) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10fc) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10fa) = 0xffff;
  *(undefined2 *)(in_RDI + 0x21f) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10f6) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10f4) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10f2) = 0xffff;
  *(undefined2 *)(in_RDI + 0x21e) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10ee) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10ec) = 0xffff;
  *(undefined2 *)(in_RDI + 0x233) = 0xffff;
  *(undefined2 *)(in_RDI + 0x225) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10e4) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10e6) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x10e2) = 0xffff;
  *(undefined2 *)(in_RDI + 0x21c) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0xf4a) = 0xffff;
  *(undefined2 *)(in_RDI + 0x1e9) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0xf46) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0xf44) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0xf3e) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0xf42) = 0xffff;
  *(undefined2 *)(in_RDI + 0x1e8) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0xf4e) = 0;
  *(undefined2 *)(in_RDI + 0x224) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x1122) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x1124) = 0xffff;
  in_RDI[0x222] = 0;
  in_RDI[0x223] = 0;
  *(undefined4 *)((long)in_RDI + 0x119c) = 0;
  *(undefined4 *)(in_RDI + 0x234) = 0;
  in_RDI[0x235] = 0;
  in_RDI[0x236] = 0;
  in_RDI[0x237] = 0;
  *(int *)(in_RDI + 0x1e2) = in_R9D;
  vocinialo(in_RCX,in_R8,in_R9D);
  *(undefined4 *)(in_RDI + 0x1e0) = in_stack_00000008;
  vocinialo(in_RCX,in_R8,in_R9D);
  *(undefined4 *)(in_RDI + 0x1e4) = undoctx._0_4_;
  vocinialo(in_RCX,in_R8,in_R9D);
  *(undefined4 *)((long)in_RDI + 0xef4) = 0xffffffff;
  return;
}

Assistant:

void vocini(voccxdef *vocctx, errcxdef *errctx, mcmcxdef *memctx,
            runcxdef *runctx, objucxdef *undoctx,
            int fuses, int daemons, int notifiers)
{
    CLRSTRUCT(*vocctx);
    vocctx->voccxerr = errctx;
    vocctx->voccxiplst = (uint)-1;
    vocctx->voccxilst = VOCISIZ;
    vocctx->voccxmem = memctx;
    vocctx->voccxrun = runctx;
    vocctx->voccxundo = undoctx;

    vocctx->voccxme  =
    vocctx->voccxme_init = 
    vocctx->voccxvtk =
    vocctx->voccxstr =
    vocctx->voccxnum =
    vocctx->voccxit  =
    vocctx->voccxhim =
    vocctx->voccxprd =
    vocctx->voccxpre =
    vocctx->voccxpre2 =
    vocctx->voccxppc =
    vocctx->voccxlsv =
    vocctx->voccxpreinit =
    vocctx->voccxper =
    vocctx->voccxprom =
    vocctx->voccxpostprom =
    vocctx->voccxpdis =
    vocctx->voccxper2 =
    vocctx->voccxperp =
    vocctx->voccxpdef =
    vocctx->voccxpdef2 =
    vocctx->voccxpask =
    vocctx->voccxpask2 =
    vocctx->voccxpask3 =
    vocctx->voccxinitrestore =
    vocctx->voccxpuv =
    vocctx->voccxpnp =
    vocctx->voccxpostact =
    vocctx->voccxendcmd =
    vocctx->voccxher = MCMONINV;
    vocctx->voccxthc = 0;
#ifdef VOCW_IN_CACHE
    vocctx->voccxwplck = MCMONINV;
#endif

    vocctx->voccxactor = MCMONINV;
    vocctx->voccxverb = MCMONINV;
    vocctx->voccxprep = MCMONINV;
    vocctx->voccxdobj = 0;
    vocctx->voccxiobj = 0;

    vocctx->voccxunknown = 0;
    vocctx->voccxlastunk = 0;

    vocctx->voc_stk_ptr = 0;
    vocctx->voc_stk_cur = 0;
    vocctx->voc_stk_end = 0;

    /* allocate fuses, daemons, notifiers */
    vocinialo(vocctx, &vocctx->voccxfus, (vocctx->voccxfuc = fuses));
    vocinialo(vocctx, &vocctx->voccxdmn, (vocctx->voccxdmc = daemons));
    vocinialo(vocctx, &vocctx->voccxalm, (vocctx->voccxalc = notifiers));

    /* no entries in vocwdef free list yet */
    vocctx->voccxwfre = VOCCXW_NONE;
}